

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::BitfieldExtractCaseInstance::compare
          (BitfieldExtractCaseInstance *this,void **inputs,void **outputs)

{
  bool bVar1;
  DataType dataType;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  Hex<8UL> hex;
  byte bVar5;
  uint local_78;
  uint local_70;
  uint local_6c;
  deUint32 ref;
  deUint32 baseVal;
  deUint32 valMask;
  deUint32 out;
  deUint32 value;
  int compNdx;
  int bits;
  int offset;
  int scalarSize;
  bool isSigned;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  BitfieldExtractCaseInstance *this_local;
  
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_IntegerFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar3->varType);
  bVar1 = glu::isDataTypeIntOrIVec(dataType);
  iVar2 = glu::getDataTypeScalarSize(dataType);
  out = 0;
  while( true ) {
    if (iVar2 <= (int)out) {
      return true;
    }
    bVar5 = (byte)*inputs[2];
    if (*inputs[2] == 0x20) {
      local_6c = 0xffffffff;
    }
    else {
      local_6c = (1 << (bVar5 & 0x1f)) - 1;
    }
    if (*inputs[1] == 0x20) {
      local_70 = 0;
    }
    else {
      local_70 = *(uint *)((long)*inputs + (long)(int)out * 4) >> ((byte)*inputs[1] & 0x1f) &
                 local_6c;
    }
    if ((bVar1) && ((local_70 & 1 << (bVar5 - 1 & 0x1f)) != 0)) {
      local_78 = local_6c ^ 0xffffffff;
    }
    else {
      local_78 = 0;
    }
    if (*(uint *)((long)*outputs + (long)(int)out * 4) != (local_70 | local_78)) break;
    out = out + 1;
  }
  poVar4 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,out);
  poVar4 = std::operator<<(poVar4,"] = ");
  hex = tcu::toHex<unsigned_int>(local_70 | local_78);
  tcu::Format::operator<<(poVar4,hex);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				offset			= *((const int*)inputs[1]);
		const int				bits			= *((const int*)inputs[2]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	valMask	= (bits == 32 ? ~0u : ((1u<<bits)-1u));
			const deUint32	baseVal	= (offset == 32) ? (0) : ((value >> offset) & valMask);
			const deUint32	ref		= baseVal | ((isSigned && (baseVal & (1<<(bits-1)))) ? ~valMask : 0u);

			if (out != ref)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}